

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

void * FT_Get_Sfnt_Table(FT_Face face,FT_Sfnt_Tag tag)

{
  FT_Driver pFVar1;
  FT_Module_Interface local_38;
  FT_Pointer _tmp_;
  FT_Module module;
  FT_Service_SFNT_Table service;
  void *table;
  FT_Sfnt_Tag tag_local;
  FT_Face face_local;
  
  service = (FT_Service_SFNT_Table)0x0;
  if ((face != (FT_Face)0x0) && ((face->face_flags & 8U) != 0)) {
    pFVar1 = face->driver;
    local_38 = (FT_Module_Interface)0x0;
    if (((pFVar1->root).clazz)->get_interface != (FT_Module_Requester)0x0) {
      local_38 = (*((pFVar1->root).clazz)->get_interface)(&pFVar1->root,"sfnt-table");
    }
    if (local_38 != (FT_Module_Interface)0x0) {
      service = (FT_Service_SFNT_Table)(**(code **)((long)local_38 + 8))(face,tag);
    }
  }
  return service;
}

Assistant:

FT_EXPORT_DEF( void* )
  FT_Get_Sfnt_Table( FT_Face      face,
                     FT_Sfnt_Tag  tag )
  {
    void*                  table = NULL;
    FT_Service_SFNT_Table  service;


    if ( face && FT_IS_SFNT( face ) )
    {
      FT_FACE_FIND_SERVICE( face, service, SFNT_TABLE );
      if ( service )
        table = service->get_table( face, tag );
    }

    return table;
  }